

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,pbrt::MajorantGrid_const*const&>
               (string *s,char *fmt,int *v,int *args,int *args_1,int *args_2,int *args_3,int *args_4
               ,int *args_5,int *args_6,int *args_7,MajorantGrid **args_8)

{
  long lVar1;
  ulong uVar2;
  char **v_00;
  char *in_RCX;
  string *in_RDX;
  string *in_RDI;
  int *in_R8;
  int *in_R9;
  int *unaff_R14;
  int *unaff_R15;
  int *unaff_retaddr;
  int *in_stack_00000008;
  MajorantGrid **in_stack_00000010;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  string *in_stack_fffffffffffffd40;
  char **in_stack_fffffffffffffd48;
  int *in_stack_fffffffffffffd50;
  char *in_stack_fffffffffffffd58;
  string *fmt_00;
  string local_298 [32];
  int *in_stack_fffffffffffffd88;
  int *in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd9c;
  string *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  string *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  int *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  LogLevel in_stack_fffffffffffffde4;
  int *in_stack_fffffffffffffde8;
  int *in_stack_fffffffffffffdf0;
  int *in_stack_fffffffffffffdf8;
  MajorantGrid **in_stack_fffffffffffffe00;
  string local_a8 [32];
  undefined4 local_88;
  undefined1 local_73;
  byte local_72;
  byte local_71;
  string local_70 [16];
  int *in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffa8;
  
  copyToFormatString(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  lVar1 = std::__cxx11::string::find((char)local_70,0x2a);
  local_71 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_70,0x73);
  local_72 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_70,100);
  local_73 = lVar1 != -1;
  if ((local_71 & 1) == 0) {
    if ((bool)local_73) {
      fmt_00 = local_70;
      uVar2 = std::__cxx11::string::find((char)fmt_00,100);
      IntegerFormatTrait<int>::fmt();
      std::__cxx11::string::replace((ulong)fmt_00,uVar2,(char *)0x1);
      std::__cxx11::string::c_str();
      formatOne<int_const&>((char *)fmt_00,in_stack_fffffffffffffd50);
      std::__cxx11::string::operator+=(in_RDI,local_a8);
      std::__cxx11::string::~string(local_a8);
    }
    else if ((local_72 & 1) == 0) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        LogFatal(in_stack_fffffffffffffde4,(char *)in_stack_fffffffffffffdd8,
                 in_stack_fffffffffffffdd4,in_stack_fffffffffffffdc8);
      }
      std::__cxx11::string::c_str();
      formatOne<int_const&>(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
      std::__cxx11::string::operator+=(in_RDI,local_298);
      std::__cxx11::string::~string(local_298);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffdd0);
      std::ostream::operator<<(&stack0xfffffffffffffde0,*(int *)in_RDX);
      v_00 = (char **)std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      std::__cxx11::string::c_str();
      formatOne<char_const*>(in_stack_fffffffffffffd58,v_00);
      std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffdb0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd88);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffdd0);
    }
    stringPrintfRecursive<int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,pbrt::MajorantGrid_const*const&>
              (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
               unaff_R14,unaff_R15,unaff_retaddr,in_stack_00000008,in_stack_00000010);
    local_88 = 0;
  }
  else {
    stringPrintfRecursiveWithPrecision<int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,pbrt::MajorantGrid_const*const&>
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
               in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               (int *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               in_stack_fffffffffffffdd8,
               (int *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffde8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffdf8,
               in_stack_fffffffffffffe00);
    local_88 = 1;
  }
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&...args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same_v<std::decay_t<T>, float>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, double>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, bool>)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}